

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_stream_parser.cc
# Opt level: O1

Status * __thiscall
google::protobuf::util::converter::JsonStreamParser::ParseDoubleHelper
          (Status *__return_storage_ptr__,JsonStreamParser *this,string *number,NumberResult *result
          )

{
  bool bVar1;
  stringpiece_ssize_type sVar2;
  char *pcVar3;
  StringPiece message;
  
  bVar1 = safe_strtod((number->_M_dataplus)._M_p,&(result->field_1).double_val);
  if (bVar1) {
    if ((this->loose_float_number_conversion_ != false) ||
       (((result->field_1).uint_val & 0x7fffffffffffffff) < 0x7ff0000000000000)) {
      result->type = DOUBLE;
      Status::Status(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    pcVar3 = "Number exceeds the range of double.";
    sVar2 = 0x23;
  }
  else {
    pcVar3 = "Unable to parse number.";
    sVar2 = 0x17;
  }
  message.length_ = sVar2;
  message.ptr_ = pcVar3;
  ReportFailure(__return_storage_ptr__,this,message);
  return __return_storage_ptr__;
}

Assistant:

util::Status JsonStreamParser::ParseDoubleHelper(const std::string& number,
                                                 NumberResult* result) {
  if (!safe_strtod(number, &result->double_val)) {
    return ReportFailure("Unable to parse number.");
  }
  if (!loose_float_number_conversion_ && !std::isfinite(result->double_val)) {
    return ReportFailure("Number exceeds the range of double.");
  }
  result->type = NumberResult::DOUBLE;
  return util::Status();
}